

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void CompareOnTheFlyNodeAnim(comparer_context *comp)

{
  scoped_chunk chunk;
  allocator<char> local_439;
  string local_438;
  scoped_chunk local_418;
  aiString local_410;
  
  local_418.ctx = comp;
  comparer_context::push_elem(comp,"aiNodeAnim");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"mNodeName",&local_439);
  comparer_context::cmp<aiString>(&local_410,comp,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mNumPositionKeys",(allocator<char> *)&local_438);
  comparer_context::cmp<unsigned_int>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mNumRotationKeys",(allocator<char> *)&local_438);
  comparer_context::cmp<unsigned_int>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mNumScalingKeys",(allocator<char> *)&local_438);
  comparer_context::cmp<unsigned_int>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mPreState",(allocator<char> *)&local_438);
  comparer_context::cmp<unsigned_int>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mPostState",(allocator<char> *)&local_438);
  comparer_context::cmp<unsigned_int>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mPositionKeys",(allocator<char> *)&local_438);
  comparer_context::cmp_bounds<aiVectorKey>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mRotationKeys",(allocator<char> *)&local_438);
  comparer_context::cmp_bounds<aiQuatKey>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mScalingKeys",(allocator<char> *)&local_438);
  comparer_context::cmp_bounds<aiVectorKey>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  scoped_chunk::~scoped_chunk(&local_418);
  return;
}

Assistant:

void CompareOnTheFlyNodeAnim(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiNodeAnim");

    comp.cmp<aiString>("mNodeName");
    comp.cmp<uint32_t>("mNumPositionKeys");
    comp.cmp<uint32_t>("mNumRotationKeys");
    comp.cmp<uint32_t>("mNumScalingKeys");
    comp.cmp<uint32_t>("mPreState");
    comp.cmp<uint32_t>("mPostState");

    comp.cmp_bounds<aiVectorKey>("mPositionKeys");
    comp.cmp_bounds<aiQuatKey>("mRotationKeys");
    comp.cmp_bounds<aiVectorKey>("mScalingKeys");
}